

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O1

int coda_mem_cursor_read_float_array
              (coda_cursor *cursor,float *dst,coda_array_ordering array_ordering)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  code *read_basic_type_function;
  int iVar4;
  
  pcVar2 = cursor->stack[(long)cursor->n + -1].type;
  cVar1 = pcVar2[1].backend;
  if (cVar1 == 2) {
    iVar3 = **(int **)(pcVar2->definition + 1);
    if (iVar3 == 0) {
      iVar3 = read_array(cursor,coda_ascii_cursor_read_float,(uint8_t *)dst,4,coda_array_ordering_c)
      ;
      iVar4 = -1;
      if (iVar3 == 0) {
        if ((array_ordering != coda_array_ordering_c) &&
           (iVar3 = transpose_array(cursor,dst,4), iVar3 != 0)) {
          return -1;
        }
        iVar4 = 0;
      }
      return iVar4;
    }
    if (iVar3 != 1) {
      __assert_fail("((coda_type_array *)type->definition)->base_type->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x389,
                    "int coda_mem_cursor_read_float_array(const coda_cursor *, float *, coda_array_ordering)"
                   );
    }
    read_basic_type_function = coda_bin_cursor_read_float;
  }
  else {
    if (cVar1 != coda_backend_binary) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,899,
                    "int coda_mem_cursor_read_float_array(const coda_cursor *, float *, coda_array_ordering)"
                   );
    }
    read_basic_type_function = coda_cursor_read_float;
  }
  iVar3 = read_array(cursor,read_basic_type_function,(uint8_t *)dst,4,array_ordering);
  return iVar3;
}

Assistant:

int coda_mem_cursor_read_float_array(const coda_cursor *cursor, float *dst, coda_array_ordering array_ordering)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_array)
    {
        return read_array(cursor, (read_function)&coda_cursor_read_float, (uint8_t *)dst, sizeof(float),
                          array_ordering);
    }
    assert(type->tag == tag_mem_data);
    if (((coda_type_array *)type->definition)->base_type->format == coda_format_binary)
    {
        return read_array(cursor, (read_function)&coda_bin_cursor_read_float, (uint8_t *)dst, sizeof(float),
                          array_ordering);
    }
    assert(((coda_type_array *)type->definition)->base_type->format == coda_format_ascii);
    if (read_array(cursor, (read_function)&coda_ascii_cursor_read_float, (uint8_t *)dst, sizeof(float),
                   coda_array_ordering_c) != 0)
    {
        return -1;
    }
    if (array_ordering != coda_array_ordering_c)
    {
        if (transpose_array(cursor, dst, sizeof(float)) != 0)
        {
            return -1;
        }
    }
    return 0;
}